

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzchangeel.cpp
# Opt level: O0

TPZGeoEl * TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh,int64_t ElemIndex,int targetSide)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TPZGeoEl **ppTVar4;
  ulong uVar5;
  ostream *poVar6;
  long lVar7;
  int64_t iVar8;
  int *piVar9;
  reference piVar10;
  int in_EDX;
  char *in_RSI;
  TPZGeoMesh *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  int c_1;
  int c;
  double coordFar;
  double coordNear;
  int64_t meshMiddleNode;
  int64_t meshFinalNode;
  int64_t meshInitNode;
  int64_t finalNode;
  int64_t initNode;
  TPZGeoElSide gelSide_1;
  int edg;
  iterator it;
  REAL dist;
  TPZGeoElSide gelSide;
  int sd;
  int tsEdge;
  int ed;
  int tsNode;
  int nd;
  TPZGeoElSide targetSideEl;
  set<int,_std::less<int>,_std::allocator<int>_> NOTtargetSideEdges_set;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideEdges_set;
  set<int,_std::less<int>,_std::allocator<int>_> targetSideNodes_set;
  TPZStack<int,_10> targetSideEdges;
  TPZStack<int,_10> targetSideNodes;
  MElementType gelType;
  TPZGeoEl *gel;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffffbc8;
  TPZGeoEl *pTVar12;
  TPZGeoNode *in_stack_fffffffffffffbd0;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffbd8;
  TPZGeoNode *in_stack_fffffffffffffbe0;
  TPZGeoNode *in_stack_fffffffffffffbe8;
  TPZAdmChunkVector<TPZGeoNode,_10> *in_stack_fffffffffffffbf0;
  bool local_35d;
  int local_2bc;
  _Self local_2b8;
  undefined4 local_2ac;
  _Self local_2a8;
  int local_29c;
  _Self local_298;
  undefined4 local_28c;
  _Self local_288;
  TPZGeoNode *local_280;
  REAL local_278;
  undefined8 local_270;
  int64_t local_268;
  int64_t local_260;
  int64_t local_258;
  int64_t local_250;
  int local_22c;
  _Self local_228;
  _Base_ptr local_220;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffde8;
  TPZGeoMesh *in_stack_fffffffffffffdf0;
  int local_204;
  _Self local_1f0;
  _Self local_1e8 [4];
  int local_1c4;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  _Base_ptr local_1b0;
  undefined1 local_1a8;
  int local_1a0;
  int local_19c;
  _Base_ptr local_198;
  undefined1 local_190;
  _Base_ptr local_188;
  undefined1 local_180;
  int local_178;
  int local_174;
  TPZStack<int,_10> local_b8;
  TPZStack<int,_10> local_70;
  undefined4 local_24;
  TPZGeoEl *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZGeoMesh::ElementVec(in_RDI);
  ppTVar4 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      ((TPZChunkVector<TPZGeoEl_*,_10> *)in_stack_fffffffffffffbf0,
                       (int64_t)in_stack_fffffffffffffbe8);
  local_20 = *ppTVar4;
  uVar5 = (**(code **)(*(long *)local_20 + 0xd0))();
  if ((uVar5 & 1) != 0) {
    local_20 = ChangeToQuadratic(in_stack_fffffffffffffdf0,
                                 (int64_t)in_stack_fffffffffffffde8._M_node);
  }
  local_24 = (**(code **)(*(long *)local_20 + 0xb8))();
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffffbe0);
  TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffffbe0);
  iVar2 = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  iVar3 = (int)((ulong)in_stack_fffffffffffffbe0 >> 0x20);
  switch(local_24) {
  case 0:
    pztopology::TPZPoint::LowerDimensionSides(in_EDX,&local_70,0);
    pztopology::TPZPoint::LowerDimensionSides(in_EDX,&local_b8,1);
    break;
  case 1:
    pztopology::TPZLine::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZLine::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 2:
    pztopology::TPZTriangle::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZTriangle::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 3:
    pztopology::TPZQuadrilateral::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZQuadrilateral::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 4:
    pztopology::TPZTetrahedron::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZTetrahedron::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 5:
    pztopology::TPZPyramid::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZPyramid::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 6:
    pztopology::TPZPrism::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZPrism::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  case 7:
    pztopology::TPZCube::LowerDimensionSides
              (iVar3,(TPZStack<int,_10> *)in_stack_fffffffffffffbd8,iVar2);
    pztopology::TPZCube::LowerDimensionSides
              ((int)((ulong)in_stack_fffffffffffffbe0 >> 0x20),
               (TPZStack<int,_10> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    break;
  default:
    poVar6 = std::operator<<((ostream *)&std::cout,"Element type not found on ");
    poVar6 = std::operator<<(poVar6,
                             "static TPZGeoEl *TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *, int64_t, int)"
                            );
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1802c64);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1802c71);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1802c7e);
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)in_stack_fffffffffffffbe0,(TPZGeoEl *)in_stack_fffffffffffffbd8,
             (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  for (local_174 = 0; lVar7 = (long)local_174,
      iVar8 = TPZVec<int>::NElements((TPZVec<int> *)&local_70), lVar7 < iVar8;
      local_174 = local_174 + 1) {
    piVar9 = TPZVec<int>::operator[]((TPZVec<int> *)&local_70,(long)local_174);
    local_178 = *piVar9;
    pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        (value_type_conflict4 *)in_stack_fffffffffffffbe8);
    local_188 = (_Base_ptr)pVar11.first._M_node;
    local_180 = pVar11.second;
  }
  iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffbd0);
  if (iVar2 == 0) {
    pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        (value_type_conflict4 *)in_stack_fffffffffffffbe8);
    local_198 = (_Base_ptr)pVar11.first._M_node;
    local_190 = pVar11.second;
  }
  for (local_19c = 0; lVar7 = (long)local_19c,
      iVar8 = TPZVec<int>::NElements((TPZVec<int> *)&local_b8), lVar7 < iVar8;
      local_19c = local_19c + 1) {
    piVar9 = TPZVec<int>::operator[]((TPZVec<int> *)&local_b8,(long)local_19c);
    local_1a0 = *piVar9;
    pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        (value_type_conflict4 *)in_stack_fffffffffffffbe8);
    local_1b0 = (_Base_ptr)pVar11.first._M_node;
    local_1a8 = pVar11.second;
  }
  iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffbd0);
  if (iVar2 == 1) {
    pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                        (value_type_conflict4 *)in_stack_fffffffffffffbe8);
    local_1c0 = (_Base_ptr)pVar11.first._M_node;
    local_1b8 = pVar11.second;
  }
  for (local_1c4 = (**(code **)(*(long *)local_20 + 0x98))(); iVar2 = local_1c4,
      iVar3 = (**(code **)(*(long *)local_20 + 0xf0))(), iVar2 < iVar3; local_1c4 = local_1c4 + 1) {
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffbe0,(TPZGeoEl *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffbd0);
    local_35d = false;
    if (iVar2 == 1) {
      local_1e8[0]._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbd8,
                      (key_type *)in_stack_fffffffffffffbd0);
      local_1f0._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffbc8);
      local_35d = std::operator==(local_1e8,&local_1f0);
    }
    if (local_35d == false) {
      iVar2 = TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffffbd0);
      if (iVar2 < 2) goto LAB_01803103;
      local_204 = 9;
    }
    else {
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbf0,
                 (value_type_conflict4 *)in_stack_fffffffffffffbe8);
LAB_01803103:
      local_204 = 0;
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x180311b);
    if (local_204 != 0) break;
  }
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<int> *)&stack0xfffffffffffffde8);
  local_220 = (_Base_ptr)
              std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_fffffffffffffbc8);
  while( true ) {
    local_228._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffbc8);
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffde8,&local_228);
    if (!bVar1) break;
    piVar10 = std::_Rb_tree_const_iterator<int>::operator*
                        ((_Rb_tree_const_iterator<int> *)0x18031c5);
    local_22c = *piVar10;
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffbe0,(TPZGeoEl *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_250 = TPZGeoElSide::SideNodeLocIndex
                          ((TPZGeoElSide *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_258 = TPZGeoElSide::SideNodeLocIndex
                          ((TPZGeoElSide *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_260 = TPZGeoElSide::SideNodeIndex
                          ((TPZGeoElSide *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_268 = TPZGeoElSide::SideNodeIndex
                          ((TPZGeoElSide *)in_stack_fffffffffffffbd8,
                           (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
    local_270 = (**(code **)(*(long *)local_20 + 0xa8))(local_20,local_22c);
    local_28c = (undefined4)local_250;
    local_288._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbd8,
                    (key_type *)in_stack_fffffffffffffbd0);
    local_298._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffbc8);
    bVar1 = std::operator!=(&local_288,&local_298);
    if (bVar1) {
      for (local_29c = 0; local_29c < 3; local_29c = local_29c + 1) {
        TPZGeoMesh::NodeVec(in_RDI);
        TPZChunkVector<TPZGeoNode,_10>::operator[]
                  (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                   (int64_t)in_stack_fffffffffffffbe8);
        local_278 = TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffbd8,
                                      (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        TPZGeoMesh::NodeVec(in_RDI);
        TPZChunkVector<TPZGeoNode,_10>::operator[]
                  (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                   (int64_t)in_stack_fffffffffffffbe8);
        local_280 = (TPZGeoNode *)
                    TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffbd8,
                                      (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        TPZGeoMesh::NodeVec(in_RDI);
        TPZChunkVector<TPZGeoNode,_10>::operator[]
                  (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                   (int64_t)in_stack_fffffffffffffbe8);
        TPZGeoNode::SetCoord
                  (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                   (REAL)in_stack_fffffffffffffbd0);
      }
    }
    else {
      local_2ac = (undefined4)local_258;
      local_2a8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffbd8,
                      (key_type *)in_stack_fffffffffffffbd0);
      local_2b8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffffbc8);
      bVar1 = std::operator!=(&local_2a8,&local_2b8);
      if (bVar1) {
        for (local_2bc = 0; local_2bc < 3; local_2bc = local_2bc + 1) {
          TPZGeoMesh::NodeVec(in_RDI);
          iVar2 = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
          TPZChunkVector<TPZGeoNode,_10>::operator[]
                    (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                     (int64_t)in_stack_fffffffffffffbe8);
          local_278 = TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffbd8,iVar2);
          in_stack_fffffffffffffbf0 = TPZGeoMesh::NodeVec(in_RDI);
          in_stack_fffffffffffffbe8 =
               TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                          (int64_t)in_stack_fffffffffffffbe8);
          in_stack_fffffffffffffbe0 =
               (TPZGeoNode *)TPZGeoNode::Coord((TPZGeoNode *)in_stack_fffffffffffffbd8,iVar2);
          local_280 = in_stack_fffffffffffffbe0;
          in_stack_fffffffffffffbd8 = TPZGeoMesh::NodeVec(in_RDI);
          in_stack_fffffffffffffbd0 =
               TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&in_stack_fffffffffffffbf0->super_TPZChunkVector<TPZGeoNode,_10>,
                          (int64_t)in_stack_fffffffffffffbe8);
          TPZGeoNode::SetCoord
                    (in_stack_fffffffffffffbe0,(int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                     (REAL)in_stack_fffffffffffffbd0);
        }
      }
    }
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x180367f);
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffbd8,
               (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
  }
  pTVar12 = local_20;
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x18036bf);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x18036cc);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x18036d9);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x18036e6);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18036f3);
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1803700);
  return pTVar12;
}

Assistant:

TPZGeoEl* TPZChangeEl::ChangeToQuarterPoint(TPZGeoMesh *Mesh, int64_t ElemIndex, int targetSide)
{
    TPZGeoEl * gel = Mesh->ElementVec()[ElemIndex];
    
    #ifdef PZDEBUG
    if(!gel)
    {
        std::cout << "Null geoel on " << __PRETTY_FUNCTION__ << std::endl;
        DebugStop();
    }
    #endif
    
    if(gel->IsLinearMapping())
    {
        gel = TPZChangeEl::ChangeToQuadratic(Mesh, ElemIndex);
    }
    
    MElementType gelType = gel->Type();
    
    TPZStack<int> targetSideNodes, targetSideEdges;
    
    switch(gelType)
    {
        case (EPoint):
        {
            TPZPoint::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPoint::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EOned):
        {
            TPZLine::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZLine::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETriangle):
        {
            TPZTriangle::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTriangle::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EQuadrilateral):
        {
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZQuadrilateral::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ETetraedro):
        {
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZTetrahedron::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPiramide):
        {
            TPZPyramid::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPyramid::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (EPrisma):
        {
            TPZPrism::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZPrism::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
		case (ECube):
        {
            TPZCube::LowerDimensionSides(targetSide,targetSideNodes,0);
            TPZCube::LowerDimensionSides(targetSide,targetSideEdges,1);
            
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
        }
    }
    
    std::set<int> targetSideNodes_set, targetSideEdges_set, NOTtargetSideEdges_set;
    TPZGeoElSide targetSideEl(gel,targetSide);
    for(int nd = 0; nd < targetSideNodes.NElements(); nd++)
    {
        int tsNode = targetSideNodes[nd];
        targetSideNodes_set.insert(tsNode);
    }
    if(targetSideEl.Dimension() == 0)
    {
        targetSideNodes_set.insert(targetSide);
    }
    for(int ed = 0; ed < targetSideEdges.NElements(); ed++)
    {
        int tsEdge = targetSideEdges[ed];
        targetSideEdges_set.insert(tsEdge);
    }
    if(targetSideEl.Dimension() == 1)
    {
        targetSideEdges_set.insert(targetSide);
    }
    for(int sd = gel->NCornerNodes(); sd < gel->NSides(); sd++)
    {
        TPZGeoElSide gelSide(gel,sd);
        if(gelSide.Dimension() == 1 && targetSideEdges_set.find(sd) == targetSideEdges_set.end())
        {
            NOTtargetSideEdges_set.insert(sd);
        }
        else if(gelSide.Dimension() > 1)
        {
            break;
        }
    }
    
    const REAL dist = 0.25;
    
    std::set<int>::iterator it;
    for(it = NOTtargetSideEdges_set.begin(); it != NOTtargetSideEdges_set.end(); it++)
    {
        int edg = *it;
        TPZGeoElSide gelSide(gel,edg);
        
        int64_t initNode = gelSide.SideNodeLocIndex(0);
        int64_t finalNode = gelSide.SideNodeLocIndex(1); 
        int64_t meshInitNode = gelSide.SideNodeIndex(0);
        int64_t meshFinalNode = gelSide.SideNodeIndex(1);
        /**
         * Embora o elemento quadratico possua mais nohs (NNodes), a topologia segue igual ao
         * elemento linear no qual o elemento quadratico foi baseado.
         *
         * Isso quer dizer que Linear(Geom::NNodes) < Quadratic(Geom::NNodes), mas Linear(Geom::NSides) = Quadratic(Geom::NSides)
         *
         * Com isso a numeracao dos nohs nos meios das arestas coincide com a numeracao dos lados unidimensionais do elemento.
         */
        int64_t meshMiddleNode = gel->NodeIndex(edg);
        //********************
                                            
        double coordNear, coordFar;
        
        if(targetSideNodes_set.find(initNode) != targetSideNodes_set.end())//drag middle node to node 0 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshInitNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshFinalNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
        else if(targetSideNodes_set.find(finalNode) != targetSideNodes_set.end())//drag middle node to node 1 of this edge
        {
            for(int c = 0; c < 3; c++)
            {
                coordNear = Mesh->NodeVec()[meshFinalNode].Coord(c);
                coordFar = Mesh->NodeVec()[meshInitNode].Coord(c);
                Mesh->NodeVec()[meshMiddleNode].SetCoord(c, (1. - dist)*coordNear + (dist)*coordFar);
            }
        }
    }				
    
    return gel;
}